

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

duckdb_state
duckdb_prepared_arrow_schema(duckdb_prepared_statement prepared,duckdb_arrow_schema *out_schema)

{
  idx_t iVar1;
  ArrowSchema *out_schema_00;
  bool bVar2;
  char cVar3;
  pointer pPVar4;
  ClientContext *this;
  PreparedStatementData *pPVar5;
  ulong uVar6;
  duckdb_state dVar7;
  char cVar8;
  duckdb_prepared_statement this_00;
  ulong __val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  prepared_names;
  vector<duckdb::LogicalType,_true> prepared_types;
  string name;
  ClientProperties properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b8;
  duckdb_arrow_schema *local_a0;
  value_type local_98;
  LogicalType local_78;
  ClientProperties local_60;
  
  if (out_schema == (duckdb_arrow_schema *)0x0) {
    dVar7 = DuckDBSuccess;
  }
  else {
    dVar7 = DuckDBError;
    if ((prepared != (duckdb_prepared_statement)0x0) && (*(long *)(prepared + 0x38) != 0)) {
      this_00 = prepared + 0x38;
      pPVar4 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)this_00);
      if ((pPVar4->data).internal.
          super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        local_a0 = out_schema;
        pPVar4 = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)this_00);
        this = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(&pPVar4->context);
        duckdb::ClientContext::GetClientProperties(&local_60,this);
        local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pPVar4 = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)this_00);
        pPVar5 = duckdb::shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&pPVar4->data);
        iVar1 = (pPVar5->properties).parameter_count;
        if (iVar1 != 0) {
          __val = 0;
          do {
            cVar8 = '\x01';
            if (9 < __val) {
              uVar6 = __val;
              cVar3 = '\x04';
              do {
                cVar8 = cVar3;
                if (uVar6 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_00c3c4ba;
                }
                if (uVar6 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_00c3c4ba;
                }
                if (uVar6 < 10000) goto LAB_00c3c4ba;
                bVar2 = 99999 < uVar6;
                uVar6 = uVar6 / 10000;
                cVar3 = cVar8 + '\x04';
              } while (bVar2);
              cVar8 = cVar8 + '\x01';
            }
LAB_00c3c4ba:
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_98,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,__val);
            duckdb::LogicalType::LogicalType(&local_78,SQLNULL);
            std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
            emplace_back<duckdb::LogicalType>(&local_b8,&local_78);
            duckdb::LogicalType::~LogicalType(&local_78);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_d8,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            __val = __val + 1;
          } while (__val != iVar1);
        }
        out_schema_00 = (ArrowSchema *)*local_a0;
        if (out_schema_00 == (ArrowSchema *)0x0) {
          dVar7 = DuckDBError;
        }
        else {
          if (out_schema_00->release != (_func_void_ArrowSchema_ptr *)0x0) {
            (*out_schema_00->release)(out_schema_00);
          }
          dVar7 = DuckDBSuccess;
          duckdb::ArrowConverter::ToArrowSchema
                    (out_schema_00,(vector<duckdb::LogicalType,_true> *)&local_b8,&local_d8,
                     &local_60);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.time_zone._M_dataplus._M_p != &local_60.time_zone.field_2) {
          operator_delete(local_60.time_zone._M_dataplus._M_p);
        }
      }
    }
  }
  return dVar7;
}

Assistant:

duckdb_state duckdb_prepared_arrow_schema(duckdb_prepared_statement prepared, duckdb_arrow_schema *out_schema) {
	if (!out_schema) {
		return DuckDBSuccess;
	}
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared);
	if (!wrapper || !wrapper->statement || !wrapper->statement->data) {
		return DuckDBError;
	}
	auto properties = wrapper->statement->context->GetClientProperties();
	duckdb::vector<duckdb::LogicalType> prepared_types;
	duckdb::vector<duckdb::string> prepared_names;

	auto count = wrapper->statement->data->properties.parameter_count;
	for (idx_t i = 0; i < count; i++) {
		// Every prepared parameter type is UNKNOWN, which we need to map to NULL according to the spec of
		// 'AdbcStatementGetParameterSchema'
		const auto type = LogicalType::SQLNULL;

		// FIXME: we don't support named parameters yet, but when we do, this needs to be updated
		auto name = std::to_string(i);
		prepared_types.push_back(type);
		prepared_names.push_back(name);
	}

	auto result_schema = (ArrowSchema *)*out_schema;
	if (!result_schema) {
		return DuckDBError;
	}

	if (result_schema->release) {
		// Need to release the existing schema before we overwrite it
		result_schema->release(result_schema);
		D_ASSERT(!result_schema->release);
	}

	ArrowConverter::ToArrowSchema(result_schema, prepared_types, prepared_names, properties);
	return DuckDBSuccess;
}